

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O3

void SNMPAgent::markTrapDeleted(SNMPTrap *trap)

{
  _List_node_base *p_Var1;
  
  p_Var1 = agents_abi_cxx11_.super__List_base<SNMPAgent_*,_std::allocator<SNMPAgent_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (agents_abi_cxx11_.super__List_base<SNMPAgent_*,_std::allocator<SNMPAgent_*>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&agents_abi_cxx11_) {
    do {
      mark_trap_deleted((list<InformItem_*,_std::allocator<InformItem_*>_> *)
                        &p_Var1[1]._M_next[100]._M_prev,trap);
      p_Var1 = (((_List_base<SNMPAgent_*,_std::allocator<SNMPAgent_*>_> *)&p_Var1->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
    } while (p_Var1 != (_List_node_base *)&agents_abi_cxx11_);
  }
  return;
}

Assistant:

void SNMPAgent::markTrapDeleted(SNMPTrap* trap){
    for(auto agent : SNMPAgent::agents){
        mark_trap_deleted(agent->informList, trap);
    }
}